

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH32_hash_t XXH32_digest(XXH32_state_t *state_in)

{
  U32 UVar1;
  uint uVar2;
  BYTE *pBVar3;
  XXH_endianess endian_detected;
  XXH32_state_t *state_in_local;
  U32 h32_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  uint local_74;
  U32 h32;
  BYTE *bEnd;
  BYTE *p;
  
  bEnd = (BYTE *)state_in->mem32;
  pBVar3 = (BYTE *)((long)state_in->mem32 + (ulong)state_in->memsize);
  if (state_in->large_len == 0) {
    local_74 = state_in->v3 + 0x165667b1;
  }
  else {
    local_74 = (state_in->v1 << 1 | state_in->v1 >> 0x1f) +
               (state_in->v2 << 7 | state_in->v2 >> 0x19) +
               (state_in->v3 << 0xc | state_in->v3 >> 0x14) +
               (state_in->v4 << 0x12 | state_in->v4 >> 0xe);
  }
  local_74 = state_in->total_len_32 + local_74;
  for (; bEnd + 4 <= pBVar3; bEnd = bEnd + 4) {
    UVar1 = XXH_read32(bEnd);
    local_74 = UVar1 * -0x3d4d51c3 + local_74;
    local_74 = (local_74 * 0x20000 | local_74 >> 0xf) * 0x27d4eb2f;
  }
  for (; bEnd < pBVar3; bEnd = bEnd + 1) {
    local_74 = (uint)*bEnd * 0x165667b1 + local_74;
    local_74 = (local_74 * 0x800 | local_74 >> 0x15) * -0x61c8864f;
  }
  uVar2 = (local_74 >> 0xf ^ local_74) * -0x7a143589;
  uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51c3;
  return uVar2 >> 0x10 ^ uVar2;
}

Assistant:

XXH_PUBLIC_API unsigned int XXH32_digest (const XXH32_state_t* state_in)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_digest_endian(state_in, XXH_littleEndian);
    else
        return XXH32_digest_endian(state_in, XXH_bigEndian);
}